

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O2

double __thiscall FIR::filter(FIR *this,double x)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar2 = this->taps;
  iVar1 = iVar2;
  while (1 < iVar1) {
    dVar3 = getBuffer(this,iVar1 + -2);
    iVar1 = iVar1 + -1;
    setBuffer(this,dVar3,iVar1);
  }
  iVar1 = 0;
  setBuffer(this,x,0);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  dVar3 = 0.0;
  for (; iVar2 != iVar1; iVar1 = iVar1 + 1) {
    dVar4 = getBuffer(this,iVar1);
    dVar5 = getCoeff(this,iVar1);
    dVar3 = dVar3 + dVar5 * dVar4;
  }
  return dVar3;
}

Assistant:

double FIR::filter(double x){

	double output=0.0;
	
	int M = this->getTaps();

	for (int i=M-1; i>0; i--){this->setBuffer(this->getBuffer(i-1),i);}
	
	this->setBuffer(x,0);
	
	for (int i=0; i<M; i++){output+=(this->getBuffer(i))*(this->getCoeff(i));}

	return output;	

}